

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

int32_t grow_data(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t to_add,int32_t size
                 ,ecs_entity_t *ids)

{
  ecs_vector_t *peVar1;
  int32_t iVar2;
  void *__s;
  void *__s_00;
  ecs_entity_t *entities_00;
  ecs_bitset_t *bs;
  ecs_switch_t *sw;
  ecs_c_info_t *c_info;
  ecs_column_t *column;
  ecs_entity_t *entities;
  ecs_c_info_t **c_info_array;
  int32_t i;
  ecs_entity_t *e;
  ecs_record_t **r;
  ecs_bs_column_t *bs_columns;
  ecs_sw_column_t *sw_columns;
  ecs_column_t *columns;
  int32_t bs_column_count;
  int32_t sw_column_count;
  int32_t column_count;
  int32_t cur_count;
  ecs_entity_t *ids_local;
  int32_t size_local;
  int32_t to_add_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  _column_count = ids;
  ids_local._0_4_ = size;
  ids_local._4_4_ = to_add;
  _size_local = data;
  data_local = (ecs_data_t *)table;
  table_local = (ecs_table_t *)world;
  _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x3f4);
  if (data_local == (ecs_data_t *)0x0) {
    __assert_fail("table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x3f4,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  _ecs_assert(_size_local != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x3f5);
  if (_size_local == (ecs_data_t *)0x0) {
    __assert_fail("data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x3f5,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  sw_column_count = ecs_table_data_count(_size_local);
  bs_column_count = *(int32_t *)((long)&data_local[2].sw_columns + 4);
  columns._4_4_ = *(int *)&data_local[2].bs_columns;
  columns._0_4_ = *(int *)&data_local[3].entities;
  sw_columns = (ecs_sw_column_t *)0x0;
  bs_columns = (ecs_bs_column_t *)0x0;
  r = (ecs_record_t **)0x0;
  ensure_data((ecs_world_t *)table_local,(ecs_table_t *)data_local,_size_local,&bs_column_count,
              (int32_t *)((long)&columns + 4),(int32_t *)&columns,(ecs_column_t **)&sw_columns,
              (ecs_sw_column_t **)&bs_columns,(ecs_bs_column_t **)&r);
  _ecs_vector_set_size(&_size_local->record_ptrs,8,0x10,(int32_t)ids_local);
  __s = _ecs_vector_addn(&_size_local->record_ptrs,8,0x10,ids_local._4_4_);
  _ecs_assert(__s != (void *)0x0,0xc,(char *)0x0,"r != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x404);
  if (__s == (void *)0x0) {
    __assert_fail("r != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x404,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  iVar2 = ecs_vector_size(_size_local->record_ptrs);
  if ((int32_t)ids_local < iVar2) {
    ids_local._0_4_ = ecs_vector_size(_size_local->record_ptrs);
  }
  _ecs_vector_set_size(&_size_local->entities,8,0x10,(int32_t)ids_local);
  __s_00 = _ecs_vector_addn(&_size_local->entities,8,0x10,ids_local._4_4_);
  _ecs_assert(__s_00 != (void *)0x0,0xc,(char *)0x0,"e != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x40c);
  if (__s_00 == (void *)0x0) {
    __assert_fail("e != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x40c,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  iVar2 = ecs_vector_size(_size_local->entities);
  _ecs_assert(iVar2 == (int32_t)ids_local,0xc,(char *)0x0,"ecs_vector_size(data->entities) == size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x40d);
  iVar2 = ecs_vector_size(_size_local->entities);
  if (iVar2 != (int32_t)ids_local) {
    __assert_fail("ecs_vector_size(data->entities) == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x40d,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  if (_column_count == (ecs_entity_t *)0x0) {
    memset(__s_00,0,(long)(ids_local._4_4_ << 3));
  }
  else {
    for (c_info_array._4_4_ = 0; c_info_array._4_4_ < ids_local._4_4_;
        c_info_array._4_4_ = c_info_array._4_4_ + 1) {
      *(ecs_entity_t *)((long)__s_00 + (long)c_info_array._4_4_ * 8) =
           _column_count[c_info_array._4_4_];
    }
  }
  memset(__s,0,(long)(ids_local._4_4_ << 3));
  peVar1 = data_local->record_ptrs;
  entities_00 = (ecs_entity_t *)_ecs_vector_first(_size_local->entities,8,0x10);
  c_info_array._4_4_ = 0;
  do {
    if (bs_column_count <= c_info_array._4_4_) {
      for (c_info_array._4_4_ = 0; c_info_array._4_4_ < columns._4_4_;
          c_info_array._4_4_ = c_info_array._4_4_ + 1) {
        ecs_switch_addn((ecs_switch_t *)bs_columns[c_info_array._4_4_].data.data,ids_local._4_4_);
      }
      for (c_info_array._4_4_ = 0; c_info_array._4_4_ < (int)columns;
          c_info_array._4_4_ = c_info_array._4_4_ + 1) {
        ecs_bitset_addn((ecs_bitset_t *)(r + (long)c_info_array._4_4_ * 2),ids_local._4_4_);
      }
      mark_table_dirty((ecs_table_t *)data_local,0);
      if ((((ulong)table_local[0xb9].lo_edges & 0x100) == 0) && (sw_column_count == 0)) {
        ecs_table_activate((ecs_world_t *)table_local,(ecs_table_t *)data_local,(ecs_query_t *)0x0,
                           true);
      }
      *(int *)&data_local[2].columns = *(int *)&data_local[2].columns + 1;
      return sw_column_count;
    }
    if (((ecs_column_t *)(sw_columns + c_info_array._4_4_))->size != 0) {
      sw = (ecs_switch_t *)0x0;
      if (peVar1 != (ecs_vector_t *)0x0) {
        sw = *(ecs_switch_t **)(&peVar1->count + (long)c_info_array._4_4_ * 2);
      }
      grow_column((ecs_world_t *)table_local,entities_00,
                  (ecs_column_t *)(sw_columns + c_info_array._4_4_),(ecs_c_info_t *)sw,
                  ids_local._4_4_,(int32_t)ids_local,true);
      iVar2 = ecs_vector_size((ecs_vector_t *)sw_columns[c_info_array._4_4_].data);
      _ecs_assert(iVar2 == (int32_t)ids_local,0xc,(char *)0x0,
                  "ecs_vector_size(columns[i].data) == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x42a);
      iVar2 = ecs_vector_size((ecs_vector_t *)sw_columns[c_info_array._4_4_].data);
      if (iVar2 != (int32_t)ids_local) {
        __assert_fail("ecs_vector_size(columns[i].data) == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                      ,0x42a,
                      "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                     );
      }
    }
    c_info_array._4_4_ = c_info_array._4_4_ + 1;
  } while( true );
}

Assistant:

static
int32_t grow_data(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t to_add,
    int32_t size,
    const ecs_entity_t *ids)
{
    ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t cur_count = ecs_table_data_count(data);
    int32_t column_count = table->column_count;
    int32_t sw_column_count = table->sw_column_count;
    int32_t bs_column_count = table->bs_column_count;
    ecs_column_t *columns = NULL;
    ecs_sw_column_t *sw_columns = NULL;
    ecs_bs_column_t *bs_columns = NULL;
    ensure_data(world, table, data, &column_count, &sw_column_count, 
        &bs_column_count, &columns, &sw_columns, &bs_columns);    

    /* Add record to record ptr array */
    ecs_vector_set_size(&data->record_ptrs, ecs_record_t*, size);
    ecs_record_t **r = ecs_vector_addn(&data->record_ptrs, ecs_record_t*, to_add);
    ecs_assert(r != NULL, ECS_INTERNAL_ERROR, NULL);
    if (ecs_vector_size(data->record_ptrs) > size) {
        size = ecs_vector_size(data->record_ptrs);
    }

    /* Add entity to column with entity ids */
    ecs_vector_set_size(&data->entities, ecs_entity_t, size);
    ecs_entity_t *e = ecs_vector_addn(&data->entities, ecs_entity_t, to_add);
    ecs_assert(e != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(ecs_vector_size(data->entities) == size, ECS_INTERNAL_ERROR, NULL);

    /* Initialize entity ids and record ptrs */
    int32_t i;
    if (ids) {
        for (i = 0; i < to_add; i ++) {
            e[i] = ids[i];
        }
    } else {
        ecs_os_memset(e, 0, ECS_SIZEOF(ecs_entity_t) * to_add);
    }
    ecs_os_memset(r, 0, ECS_SIZEOF(ecs_record_t*) * to_add);

    /* Add elements to each column array */
    ecs_c_info_t **c_info_array = table->c_info;
    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
    for (i = 0; i < column_count; i ++) {
        ecs_column_t *column = &columns[i];
        if (!column->size) {
            continue;
        }

        ecs_c_info_t *c_info = NULL;
        if (c_info_array) {
            c_info = c_info_array[i];
        }

        grow_column(world, entities, column, c_info, to_add, size, true);
        ecs_assert(ecs_vector_size(columns[i].data) == size, 
            ECS_INTERNAL_ERROR, NULL);
    }

    /* Add elements to each switch column */
    for (i = 0; i < sw_column_count; i ++) {
        ecs_switch_t *sw = sw_columns[i].data;
        ecs_switch_addn(sw, to_add);
    }

    /* Add elements to each bitset column */
    for (i = 0; i < bs_column_count; i ++) {
        ecs_bitset_t *bs = &bs_columns[i].data;
        ecs_bitset_addn(bs, to_add);
    }

    /* If the table is monitored indicate that there has been a change */
    mark_table_dirty(table, 0);

    if (!world->in_progress && !cur_count) {
        ecs_table_activate(world, table, 0, true);
    }

    table->alloc_count ++;

    /* Return index of first added entity */
    return cur_count;
}